

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_hexdec(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  jx9_value *pValue;
  byte *zSrc;
  ushort **ppuVar2;
  char in_CL;
  undefined7 in_register_00000009;
  jx9_int64 iValue;
  byte *pbVar3;
  jx9_int64 iVal;
  int nLen;
  
  if (nArg < 1) {
    jx9_result_int(pCtx,-1);
  }
  else {
    iVal = 0;
    pValue = *apArg;
    if ((pValue->iFlags & 1) == 0) {
      iVal = jx9_value_to_int64(pValue);
      iValue = iVal;
    }
    else {
      zSrc = (byte *)jx9_value_to_string(pValue,&nLen);
      pbVar3 = zSrc + nLen;
      while (iValue = 0, zSrc < pbVar3) {
        bVar1 = *zSrc;
        if ((ulong)(long)(char)bVar1 < 0xffffffffffffffc0) {
          ppuVar2 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar2 + (long)(char)bVar1 * 2 + 1) & 0x10) != 0) {
            SyHexStrToInt64((char *)zSrc,(int)pbVar3 - (int)zSrc,&iVal,
                            (char **)CONCAT71(in_register_00000009,in_CL));
            iValue = iVal;
            break;
          }
          zSrc = zSrc + 1;
        }
        else {
          zSrc = zSrc + 1;
          if (zSrc < pbVar3) {
            in_CL = -(*zSrc & 0xc0);
          }
        }
      }
    }
    jx9_result_int64(pCtx,iValue);
  }
  return 0;
}

Assistant:

static int jx9Builtin_hexdec(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zEnd;
	jx9_int64 iVal;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	iVal = 0;
	if( jx9_value_is_string(apArg[0]) ){
		/* Extract the given string */
		zString = jx9_value_to_string(apArg[0], &nLen);
		/* Delimit the string */
		zEnd = &zString[nLen];
		/* Ignore non hex-stream */
		while( zString < zEnd ){
			if( (unsigned char)zString[0] >= 0xc0 ){
				/* UTF-8 stream */
				zString++;
				while( zString < zEnd && (((unsigned char)zString[0] & 0xc0) == 0x80) ){
					zString++;
				}
			}else{
				if( SyisHex(zString[0]) ){
					break;
				}
				/* Ignore */
				zString++;
			}
		}
		if( zString < zEnd ){
			/* Cast */
			SyHexStrToInt64(zString, (sxu32)(zEnd-zString), (void *)&iVal, 0);
		}
	}else{
		/* Extract as a 64-bit integer */
		iVal = jx9_value_to_int64(apArg[0]);
	}
	/* Return the number */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}